

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgcrd(fitsfile *fptr,char *name,char *card,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  char *local_120;
  char *gotstar;
  char *ptr2;
  char *ptr1;
  char cardname [75];
  char keyname [75];
  int local_64;
  int hier;
  int exact;
  int match;
  int wild;
  int kk;
  int jj;
  int ii;
  int cardlen;
  int namelenminus1;
  int namelen_limit;
  int namelen;
  int ntodo;
  int nextkey;
  int nkeys;
  int *status_local;
  char *card_local;
  char *name_local;
  fitsfile *fptr_local;
  
  kk = 0;
  stack0xffffffffffffff98 = 0;
  if (*status < 1) {
    cardname[0x48] = '\0';
    for (; name[kk] == ' '; kk = kk + 1) {
    }
    _nextkey = status;
    status_local = (int *)card;
    card_local = name;
    name_local = (char *)fptr;
    strncat(cardname + 0x48,name + kk,0x4a);
    sVar2 = strlen(cardname + 0x48);
    namelenminus1 = (int)sVar2;
    while( true ) {
      bVar4 = false;
      if (0 < namelenminus1) {
        bVar4 = cardname[(long)(namelenminus1 + -1) + 0x48] == ' ';
      }
      if (!bVar4) break;
      namelenminus1 = namelenminus1 + -1;
    }
    cardname[(long)namelenminus1 + 0x48] = '\0';
    for (kk = 0; kk < namelenminus1; kk = kk + 1) {
      iVar1 = toupper((int)cardname[(long)kk + 0x48]);
      cardname[(long)kk + 0x48] = (char)iVar1;
    }
    if (cardname[0x48] < 'I') {
      if (cardname[0x48] < 'H') {
        local_12c = 1;
      }
      else {
        local_12c = strncmp("HIERARCH",cardname + 0x48,8);
      }
      local_128 = local_12c;
    }
    else {
      local_128 = -1;
    }
    if (local_128 == 0) {
      if (namelenminus1 == 8) {
        stack0xffffffffffffff98 = 1;
      }
      else {
        ptr2 = cardname + 0x48;
        for (gotstar = keyname; *gotstar == ' '; gotstar = gotstar + 1) {
        }
        namelenminus1 = 0;
        for (; *gotstar != '\0'; gotstar = gotstar + 1) {
          *ptr2 = *gotstar;
          ptr2 = ptr2 + 1;
          namelenminus1 = namelenminus1 + 1;
        }
        *ptr2 = '\0';
      }
    }
    cardlen = namelenminus1;
    local_120 = (char *)0x0;
    if ((namelenminus1 < 9) &&
       (((pcVar3 = strchr(cardname + 0x48,0x3f), pcVar3 != (char *)0x0 ||
         (local_120 = strchr(cardname + 0x48,0x2a), local_120 != (char *)0x0)) ||
        (pcVar3 = strchr(cardname + 0x48,0x23), pcVar3 != (char *)0x0)))) {
      exact = 1;
      if (local_120 != (char *)0x0) {
        cardlen = cardlen + -2;
      }
    }
    else {
      exact = 0;
    }
    ffghps((fitsfile *)name_local,&ntodo,&namelen,_nextkey);
    if (namelenminus1 + -1 < 2) {
      local_130 = 1;
    }
    else {
      local_130 = namelenminus1 + -1;
    }
    ii = local_130;
    namelen_limit = (ntodo - namelen) + 1;
    for (wild = 0; wild < 2; wild = wild + 1) {
      for (match = 0; match < namelen_limit; match = match + 1) {
        ffgnky((fitsfile *)name_local,(char *)status_local,_nextkey);
        if (stack0xffffffffffffff98 == 0) {
          ffgknm((char *)status_local,(char *)&ptr1,&jj,_nextkey);
          if ((cardlen <= jj) && ((exact != 0 || (jj == namelenminus1)))) {
            for (kk = 0; kk < jj; kk = kk + 1) {
              if ('`' < cardname[(long)kk + -8]) {
                iVar1 = toupper((int)cardname[(long)kk + -8]);
                cardname[(long)kk + -8] = (char)iVar1;
              }
            }
            if (exact == 0) {
              if (cardname[(long)ii + 0x48] == cardname[(long)ii + -8]) {
                if (cardname[0x48] < (char)ptr1) {
                  local_13c = -1;
                }
                else {
                  if ((char)ptr1 < cardname[0x48]) {
                    local_140 = 1;
                  }
                  else {
                    local_140 = strncmp(cardname + 0x48,(char *)&ptr1,(long)ii);
                  }
                  local_13c = local_140;
                }
                if (local_13c == 0) {
                  return *_nextkey;
                }
              }
              else if ((namelenminus1 == 0) && (jj == 0)) {
                return *_nextkey;
              }
            }
            else {
              ffcmps(cardname + 0x48,(char *)&ptr1,1,&hier,&local_64);
              if (hier != 0) {
                return *_nextkey;
              }
            }
          }
        }
        else {
          if ((char)*status_local < 'I') {
            if ((char)*status_local < 'H') {
              local_138 = 1;
            }
            else {
              local_138 = strncmp("HIERARCH",(char *)status_local,8);
            }
            local_134 = local_138;
          }
          else {
            local_134 = -1;
          }
          if (local_134 == 0) {
            return *_nextkey;
          }
        }
      }
      if ((exact != 0) || (wild == 1)) break;
      ffmaky((fitsfile *)name_local,1,_nextkey);
      namelen_limit = namelen + -1;
    }
    *_nextkey = 0xca;
    fptr_local._4_4_ = 0xca;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcrd( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *name,         /* I - name of keyword to read  */
            char *card,         /* O - keyword card             */
            int  *status)       /* IO - error status            */
/*
  Read (get) the named keyword, returning the entire keyword card up to
  80 characters long.  
  The returned card value is null terminated with any trailing blank 
  characters removed.

  If the input name contains wild cards ('?' matches any single char
  and '*' matches any sequence of chars, # matches any string of decimal
  digits) then the search ends once the end of header is reached and does 
  not automatically resume from the top of the header.
*/
{
    int nkeys, nextkey, ntodo, namelen, namelen_limit, namelenminus1, cardlen;
    int ii = 0, jj, kk, wild, match, exact, hier = 0;
    char keyname[FLEN_KEYWORD], cardname[FLEN_KEYWORD];
    char *ptr1, *ptr2, *gotstar;

    if (*status > 0)
        return(*status);

    *keyname = '\0';
    
    while (name[ii] == ' ')  /* skip leading blanks in name */
        ii++;

    strncat(keyname, &name[ii], FLEN_KEYWORD - 1);

    namelen = strlen(keyname);

    while (namelen > 0 && keyname[namelen - 1] == ' ')
         namelen--;            /* ignore trailing blanks in name */

    keyname[namelen] = '\0';  /* terminate the name */

    for (ii=0; ii < namelen; ii++)       
        keyname[ii] = toupper(keyname[ii]);    /*  make upper case  */

    if (FSTRNCMP("HIERARCH", keyname, 8) == 0)
    {
        if (namelen == 8)
        {
            /* special case: just looking for any HIERARCH keyword */
            hier = 1;
        }
        else
        {
            /* ignore the leading HIERARCH and look for the 'real' name */
            /* starting with first non-blank character following HIERARCH */
            ptr1 = keyname;
            ptr2 = &keyname[8];

            while(*ptr2 == ' ')
                ptr2++;

            namelen = 0;
            while(*ptr2)
            {
                *ptr1 = *ptr2;
                 ptr1++;
                 ptr2++;
                 namelen++;
            }
            *ptr1 = '\0';
        }
    }

    /* does input name contain wild card chars?  ('?',  '*', or '#') */
    /* wild cards are currently not supported with HIERARCH keywords */

    namelen_limit = namelen;
    gotstar = 0;
    if (namelen < 9 && 
       (strchr(keyname,'?') || (gotstar = strchr(keyname,'*')) || 
        strchr(keyname,'#')) )
    {
        wild = 1;

        /* if we found a '*' wild card in the name, there might be */
        /* more than one.  Support up to 2 '*' in the template. */
        /* Thus we need to compare keywords whose names have at least */
        /* namelen - 2 characters.                                   */
        if (gotstar)
           namelen_limit -= 2;           
    }
    else
        wild = 0;

    ffghps(fptr, &nkeys, &nextkey, status); /* get no. keywords and position */

    namelenminus1 = maxvalue(namelen - 1, 1);
    ntodo = nkeys - nextkey + 1;  /* first, read from next keyword to end */
    for (jj=0; jj < 2; jj++)
    {
      for (kk = 0; kk < ntodo; kk++)
      {
        ffgnky(fptr, card, status);     /* get next keyword */

        if (hier)
        {
           if (FSTRNCMP("HIERARCH", card, 8) == 0)
                return(*status);  /* found a HIERARCH keyword */
        }
        else
        {
          ffgknm(card, cardname, &cardlen, status); /* get the keyword name */

          if (cardlen >= namelen_limit)  /* can't match if card < name */
          { 
            /* if there are no wild cards, lengths must be the same */
            if (!( !wild && cardlen != namelen) )
            {
              for (ii=0; ii < cardlen; ii++)
              {    
                /* make sure keyword is in uppercase */
                if (cardname[ii] > 96)
                {
                  /* This assumes the ASCII character set in which */
                  /* upper case characters start at ASCII(97)  */
                  /* Timing tests showed that this is 20% faster */
                  /* than calling the isupper function.          */

                  cardname[ii] = toupper(cardname[ii]);  /* make upper case */
                }
              }

              if (wild)
              {
                ffcmps(keyname, cardname, 1, &match, &exact);
                if (match)
                    return(*status); /* found a matching keyword */
              }
              else if (keyname[namelenminus1] == cardname[namelenminus1])
              {
                /* test the last character of the keyword name first, on */
                /* the theory that it is less likely to match then the first */
                /* character since many keywords begin with 'T', for example */

                if (FSTRNCMP(keyname, cardname, namelenminus1) == 0)
                {
                  return(*status);   /* found the matching keyword */
                }
              }
	      else if (namelen == 0 && cardlen == 0)
	      {
	         /* matched a blank keyword */
		 return(*status);
	      }
            }
          }
        }
      }

      if (wild || jj == 1)
            break;  /* stop at end of header if template contains wildcards */

      ffmaky(fptr, 1, status);  /* reset pointer to beginning of header */
      ntodo = nextkey - 1;      /* number of keyword to read */ 
    }

    return(*status = KEY_NO_EXIST);  /* couldn't find the keyword */
}